

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O1

bool __thiscall
glcts::TextureBufferTextureBufferRange::checkResult
          (TextureBufferTextureBufferRange *this,FormatInfo *info,char *phase,bool transformFeedback
          )

{
  GLenum GVar1;
  GLuint *pGVar2;
  long *plVar3;
  undefined8 uVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  int *piVar8;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  TestError *this_00;
  undefined7 in_register_00000009;
  undefined4 uVar12;
  GLuint *pGVar13;
  TextureBufferTextureBufferRange *pTVar14;
  ulong uVar15;
  GLuint GVar16;
  FormatInfo *pFVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  vector<float,_std::allocator<float>_> expected;
  stringstream expVal;
  stringstream resVal;
  long *local_3c0 [2];
  long local_3b0 [2];
  FormatInfo *local_3a0;
  char *local_398;
  undefined1 local_390 [80];
  undefined1 local_340 [8];
  pointer local_338;
  undefined1 local_330 [8];
  string local_328 [96];
  ios_base local_2c8 [8];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [8];
  string local_1a0 [104];
  ios_base aiStack_138 [264];
  size_type sVar7;
  
  local_3a0 = info;
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  sVar7 = CONCAT44(extraout_var,iVar5);
  pGVar2 = &this->m_tf_value_buffer_id;
  pGVar13 = &this->m_tf_size_buffer_id;
  bVar18 = (int)CONCAT71(in_register_00000009,transformFeedback) != 0;
  if (!bVar18) {
    pGVar13 = &this->m_ssbo_size_id;
    pGVar2 = &this->m_ssbo_value_id;
  }
  uVar12 = 0x90d2;
  if (bVar18) {
    uVar12 = 0x8c8e;
  }
  GVar16 = *pGVar2;
  local_390._56_8_ = this;
  (**(code **)(sVar7 + 0x40))(uVar12,*pGVar13);
  dVar6 = (**(code **)(sVar7 + 0x800))();
  glu::checkError(dVar6,"Error binding buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x437);
  piVar8 = (int *)(**(code **)(sVar7 + 0xd00))(uVar12,0,4,1);
  dVar6 = (**(code **)(sVar7 + 0x800))();
  glu::checkError(dVar6,"Error mapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x43a);
  if (*piVar8 != 1) {
    local_398 = (char *)CONCAT44(local_398._4_4_,GVar16);
    local_340 = (undefined1  [8])
                ((((TestCaseBase *)local_390._56_8_)->super_TestCase).super_TestNode.m_testCtx)->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_338);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_338,"Texture size is wrong for ",0x1a);
    iVar5 = (int)(ostringstream *)&local_338;
    if (phase == (char *)0x0) {
      std::ios::clear((int)local_338[-3] + iVar5);
    }
    else {
      sVar9 = strlen(phase);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,phase,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338," phase \n",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_338,"Internal Format: ",0x11);
    pcVar10 = glu::getUncompressedTextureFormatName(local_3a0->m_internal_format);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)local_338[-3] + iVar5);
    }
    else {
      sVar9 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,pcVar10,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_338,"Expected size:   ",0x11);
    std::ostream::operator<<((ostringstream *)&local_338,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_338,"Result size:     ",0x11);
    std::ostream::_M_insert<void_const*>((ostringstream *)&local_338);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_340,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_338);
    std::ios_base::~ios_base(local_2c8);
    GVar16 = (GLuint)local_398;
  }
  (**(code **)(sVar7 + 0x1670))(uVar12);
  dVar6 = (**(code **)(sVar7 + 0x800))();
  glu::checkError(dVar6,"Error unmapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,1099);
  (**(code **)(sVar7 + 0x40))(uVar12,GVar16);
  dVar6 = (**(code **)(sVar7 + 0x800))();
  glu::checkError(dVar6,"Error binding buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x44e);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  std::__cxx11::stringstream::stringstream(local_1b8);
  GVar1 = local_3a0->m_output_type;
  local_390._64_8_ = sVar7;
  local_390._72_4_ = uVar12;
  if (GVar1 == 0x1404) {
    lVar11 = (**(code **)(sVar7 + 0xd00))(uVar12,0,local_3a0->m_ssbo_value_size,1);
    dVar6 = (**(code **)(sVar7 + 0x800))();
    glu::checkError(dVar6,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x475);
    pFVar17 = local_3a0;
    pTVar14 = (TextureBufferTextureBufferRange *)local_390;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)pTVar14,(ulong)local_3a0->m_n_components,
               (allocator_type *)local_3c0);
    fillOutputData(pTVar14,(GLubyte *)local_390._0_8_,pFVar17);
    if (pFVar17->m_n_components != 0) {
      bVar18 = true;
      uVar15 = 0;
      local_398 = phase;
      do {
        if (*(int *)(lVar11 + uVar15 * 4) != *(int *)(local_390._0_8_ + uVar15 * 4)) {
          local_3c0[0] = local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,0x1b3c1e9);
          std::__cxx11::stringbuf::str(local_328);
          if (local_3c0[0] != local_3b0) {
            operator_delete(local_3c0[0],local_3b0[0] + 1);
          }
          local_3c0[0] = local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,0x1b3c1e9);
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_3c0[0] != local_3b0) {
            operator_delete(local_3c0[0],local_3b0[0] + 1);
          }
          std::ostream::operator<<(local_330,*(int *)(local_390._0_8_ + uVar15 * 4));
          std::ostream::operator<<(local_1a8,*(int *)(lVar11 + uVar15 * 4));
          pcVar10 = glu::getUncompressedTextureFormatName(pFVar17->m_internal_format);
          std::__cxx11::stringbuf::str();
          plVar3 = local_3c0[0];
          std::__cxx11::stringbuf::str();
          logError((TextureBufferTextureBufferRange *)local_390._56_8_,local_398,pcVar10,
                   (GLuint)uVar15,(char *)plVar3,(char *)local_390._24_8_);
          pFVar17 = local_3a0;
          if ((undefined1 *)local_390._24_8_ != local_390 + 0x28) {
            operator_delete((void *)local_390._24_8_,local_390._40_8_ + 1);
          }
          if (local_3c0[0] != local_3b0) {
            operator_delete(local_3c0[0],local_3b0[0] + 1);
          }
          bVar18 = false;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < pFVar17->m_n_components);
      goto LAB_00cf15d7;
    }
  }
  else if (GVar1 == 0x1405) {
    lVar11 = (**(code **)(sVar7 + 0xd00))(uVar12,0,local_3a0->m_ssbo_value_size,1);
    dVar6 = (**(code **)(sVar7 + 0x800))();
    glu::checkError(dVar6,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x491);
    pFVar17 = local_3a0;
    pTVar14 = (TextureBufferTextureBufferRange *)local_390;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pTVar14,
               (ulong)local_3a0->m_n_components,(allocator_type *)local_3c0);
    fillOutputData(pTVar14,(GLubyte *)local_390._0_8_,pFVar17);
    if (pFVar17->m_n_components != 0) {
      bVar18 = true;
      uVar15 = 0;
      local_398 = phase;
      do {
        if (*(int *)(lVar11 + uVar15 * 4) != *(int *)(local_390._0_8_ + uVar15 * 4)) {
          local_3c0[0] = local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,0x1b3c1e9);
          std::__cxx11::stringbuf::str(local_328);
          if (local_3c0[0] != local_3b0) {
            operator_delete(local_3c0[0],local_3b0[0] + 1);
          }
          local_3c0[0] = local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,0x1b3c1e9);
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_3c0[0] != local_3b0) {
            operator_delete(local_3c0[0],local_3b0[0] + 1);
          }
          std::ostream::_M_insert<unsigned_long>((ulong)local_330);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          pcVar10 = glu::getUncompressedTextureFormatName(pFVar17->m_internal_format);
          std::__cxx11::stringbuf::str();
          plVar3 = local_3c0[0];
          std::__cxx11::stringbuf::str();
          logError((TextureBufferTextureBufferRange *)local_390._56_8_,local_398,pcVar10,
                   (GLuint)uVar15,(char *)plVar3,(char *)local_390._24_8_);
          pFVar17 = local_3a0;
          if ((undefined1 *)local_390._24_8_ != local_390 + 0x28) {
            operator_delete((void *)local_390._24_8_,local_390._40_8_ + 1);
          }
          if (local_3c0[0] != local_3b0) {
            operator_delete(local_3c0[0],local_3b0[0] + 1);
          }
          bVar18 = false;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < pFVar17->m_n_components);
      goto LAB_00cf15d7;
    }
  }
  else {
    if (GVar1 != 0x1406) {
      (**(code **)(sVar7 + 0x1670))(uVar12);
      dVar6 = (**(code **)(sVar7 + 0x800))();
      glu::checkError(dVar6,"Error ummapping buffer!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x4ac);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not allowed output type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                 ,0x4ae);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar11 = (**(code **)(sVar7 + 0xd00))(uVar12,0,local_3a0->m_ssbo_value_size,1);
    dVar6 = (**(code **)(sVar7 + 0x800))();
    glu::checkError(dVar6,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x45a);
    pFVar17 = local_3a0;
    pTVar14 = (TextureBufferTextureBufferRange *)local_390;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)pTVar14,(ulong)local_3a0->m_n_components,
               (allocator_type *)local_3c0);
    fillOutputData(pTVar14,(GLubyte *)local_390._0_8_,pFVar17);
    if (pFVar17->m_n_components != 0) {
      fVar21 = 0.0001;
      bVar18 = true;
      uVar15 = 0;
      local_390._76_4_ = 0.0001;
      local_398 = phase;
      do {
        fVar19 = *(float *)(lVar11 + uVar15 * 4) - *(float *)(local_390._0_8_ + uVar15 * 4);
        fVar20 = -fVar19;
        if (-fVar19 <= fVar19) {
          fVar20 = fVar19;
        }
        if (fVar21 < fVar20) {
          local_3c0[0] = local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,0x1b3c1e9);
          std::__cxx11::stringbuf::str(local_328);
          if (local_3c0[0] != local_3b0) {
            operator_delete(local_3c0[0],local_3b0[0] + 1);
          }
          local_3c0[0] = local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,0x1b3c1e9);
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_3c0[0] != local_3b0) {
            operator_delete(local_3c0[0],local_3b0[0] + 1);
          }
          std::ostream::_M_insert<double>((double)*(float *)(local_390._0_8_ + uVar15 * 4));
          std::ostream::_M_insert<double>((double)*(float *)(lVar11 + uVar15 * 4));
          pcVar10 = glu::getUncompressedTextureFormatName(local_3a0->m_internal_format);
          std::__cxx11::stringbuf::str();
          plVar3 = local_3c0[0];
          std::__cxx11::stringbuf::str();
          logError((TextureBufferTextureBufferRange *)local_390._56_8_,local_398,pcVar10,
                   (GLuint)uVar15,(char *)plVar3,(char *)local_390._24_8_);
          if ((undefined1 *)local_390._24_8_ != local_390 + 0x28) {
            operator_delete((void *)local_390._24_8_,local_390._40_8_ + 1);
          }
          if (local_3c0[0] != local_3b0) {
            operator_delete(local_3c0[0],local_3b0[0] + 1);
          }
          bVar18 = false;
          fVar21 = (float)local_390._76_4_;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < local_3a0->m_n_components);
      goto LAB_00cf15d7;
    }
  }
  bVar18 = true;
LAB_00cf15d7:
  if ((_func_int **)local_390._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_390._0_8_,local_390._16_8_ - local_390._0_8_);
  }
  uVar4 = local_390._64_8_;
  (**(code **)(local_390._64_8_ + 0x1670))(local_390._72_4_);
  dVar6 = (**(code **)(uVar4 + 0x800))();
  glu::checkError(dVar6,"Error ummapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x4b3);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  return bVar18;
}

Assistant:

bool TextureBufferTextureBufferRange::checkResult(FormatInfo& info, const char* phase, bool transformFeedback)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum bufferTarget  = GL_NONE;
	glw::GLuint bufferSizeId  = GL_NONE;
	glw::GLuint bufferValueId = GL_NONE;

	if (transformFeedback)
	{
		bufferTarget  = GL_TRANSFORM_FEEDBACK_BUFFER;
		bufferSizeId  = m_tf_size_buffer_id;
		bufferValueId = m_tf_value_buffer_id;
	}
	else
	{
		bufferTarget  = GL_SHADER_STORAGE_BUFFER;
		bufferSizeId  = m_ssbo_size_id;
		bufferValueId = m_ssbo_value_id;
	}

	bool testResult = true;

	/* Get result data */
	gl.bindBuffer(bufferTarget, bufferSizeId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer!");

	glw::GLint* size = (glw::GLint*)gl.mapBufferRange(bufferTarget, 0, sizeof(glw::GLint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

	const glw::GLint expectedSize = 1;

	/* Reagrding test specification size should be equal 1*/
	/* Log error if expected and result data are not equal */
	if (*size != expectedSize)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Texture size is wrong for " << phase << " phase \n"
						   << "Internal Format: " << glu::getUncompressedTextureFormatName(info.get_internal_format())
						   << "\n"
						   << "Expected size:   " << expectedSize << "\n"
						   << "Result size:     " << size << "\n"
						   << tcu::TestLog::EndMessage;
	}

	gl.unmapBuffer(bufferTarget);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer!");

	gl.bindBuffer(bufferTarget, bufferValueId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer!");

	std::stringstream expVal;
	std::stringstream resVal;

	/* Log error if expected and result data are not equal */
	switch (info.get_output_type())
	{
	case GL_FLOAT:
	{
		glw::GLfloat* res =
			(glw::GLfloat*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLfloat> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (de::abs(res[i] - expected[i]) > m_epsilon_float)
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	case GL_INT:
	{
		glw::GLint* res = (glw::GLint*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLint> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (res[i] != expected[i])
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	case GL_UNSIGNED_INT:
	{
		glw::GLuint* res =
			(glw::GLuint*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLuint> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (res[i] != expected[i])
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	default:
	{
		gl.unmapBuffer(bufferTarget);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer!");

		TCU_FAIL("Not allowed output type");
	}
	}

	gl.unmapBuffer(bufferTarget);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer!");

	return testResult;
}